

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldriver.cpp
# Opt level: O2

void QSqlDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 uVar1;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      uVar1 = (**(code **)(*(long *)_o + 0x108))();
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(undefined1 *)*_a = uVar1;
      }
    }
    else if (_id == 0) {
      notification((QSqlDriver *)_o,(QString *)_a[1],*_a[2],(QVariant *)_a[3]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      *(undefined4 *)*_a = *(undefined4 *)(*(long *)(_o + 8) + 0x98);
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      *(undefined4 *)(*(long *)(_o + 8) + 0x98) = **_a;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::
    indexOfMethod<void(QSqlDriver::*)(QString_const&,QSqlDriver::NotificationSource,QVariant_const&)>
              ((QtMocHelpers *)_a,(void **)notification,0,0);
    return;
  }
  return;
}

Assistant:

void QSqlDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSqlDriver *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->notification((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSqlDriver::NotificationSource>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3]))); break;
        case 1: { bool _r = _t->cancelQuery();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSqlDriver::*)(const QString & , QSqlDriver::NotificationSource , const QVariant & )>(_a, &QSqlDriver::notification, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}